

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool __thiscall BackwardPass::CanDeadStoreInstrForScopeObjRemoval(BackwardPass *this,Sym *sym)

{
  OpCode OVar1;
  Func *func;
  bool bVar2;
  JITTimeFunctionBody *this_00;
  HelperCallOpnd *pHVar3;
  StackSym *pSVar4;
  Instr *pIVar5;
  RegOpnd *this_01;
  
  if (this->tag != DeadStorePhase) {
    return false;
  }
  bVar2 = Func::IsStackArgsEnabled(this->currentInstr->m_func);
  if (!bVar2) {
    return false;
  }
  func = this->currentInstr->m_func;
  this_00 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
  bVar2 = JITTimeFunctionBody::GetDoScopeObjectCreation(this_00);
  pIVar5 = this->currentInstr;
  OVar1 = pIVar5->m_opcode;
  if (OVar1 < InitCachedScope) {
    if (1 < OVar1 - 0xdb) {
      if (OVar1 != LdSlot) {
        return false;
      }
      if (sym == (Sym *)0x0) {
        return false;
      }
      bVar2 = IsFormalParamSym((BackwardPass *)(ulong)(OVar1 - 0xdb),func,sym);
LAB_003dd13f:
      if (bVar2 == false) {
        return false;
      }
      return true;
    }
    if (bVar2) {
      return false;
    }
    this_01 = (RegOpnd *)pIVar5->m_src1;
  }
  else if (OVar1 - 0x282 < 2) {
    if (bVar2) {
      return false;
    }
    this_01 = (RegOpnd *)pIVar5->m_src2;
  }
  else {
    if (OVar1 != CallHelper) {
      if (OVar1 != InitCachedScope) {
        return false;
      }
      if (bVar2) {
        return false;
      }
      bVar2 = IR::Opnd::IsScopeObjOpnd(pIVar5->m_dst,func);
      goto LAB_003dd13f;
    }
    if (bVar2) {
      return false;
    }
    pHVar3 = IR::Opnd::AsHelperCallOpnd(pIVar5->m_src1);
    if (pHVar3->m_fnHelper != HelperOP_InitCachedFuncs) {
      return false;
    }
    pSVar4 = IR::Opnd::GetStackSym(this->currentInstr->m_src2);
    if ((pSVar4->field_0x18 & 1) == 0) {
      pIVar5 = (Instr *)0x0;
    }
    else {
      pIVar5 = (pSVar4->field_5).m_instrDef;
    }
    this_01 = IR::Opnd::AsRegOpnd(pIVar5->m_src1);
  }
  bVar2 = IR::Opnd::IsScopeObjOpnd(&this_01->super_Opnd,func);
  return bVar2;
}

Assistant:

bool
BackwardPass::CanDeadStoreInstrForScopeObjRemoval(Sym *sym) const
{
    if (tag == Js::DeadStorePhase && this->currentInstr->m_func->IsStackArgsEnabled())
    {
        Func * currFunc = this->currentInstr->m_func;
        bool doScopeObjCreation = currFunc->GetJITFunctionBody()->GetDoScopeObjectCreation();
        switch (this->currentInstr->m_opcode)
        {
            case Js::OpCode::InitCachedScope:
            {
                if(!doScopeObjCreation && this->currentInstr->GetDst()->IsScopeObjOpnd(currFunc))
                {
                    /*
                    *   We don't really dead store this instruction. We just want the source sym of this instruction
                    *   to NOT be tracked as USED by this instruction.
                    *   This instr will effectively be lowered to dest = MOV NULLObject, in the lowerer phase.
                    */
                    return true;
                }
                break;
            }
            case Js::OpCode::LdSlot:
            {
                if (sym && IsFormalParamSym(currFunc, sym))
                {
                    return true;
                }
                break;
            }
            case Js::OpCode::CommitScope:
            case Js::OpCode::GetCachedFunc:
            {
                return !doScopeObjCreation && this->currentInstr->GetSrc1()->IsScopeObjOpnd(currFunc);
            }
            case Js::OpCode::BrFncCachedScopeEq:
            case Js::OpCode::BrFncCachedScopeNeq:
            {
                return !doScopeObjCreation && this->currentInstr->GetSrc2()->IsScopeObjOpnd(currFunc);
            }
            case Js::OpCode::CallHelper:
            {
                if (!doScopeObjCreation && this->currentInstr->GetSrc1()->AsHelperCallOpnd()->m_fnHelper == IR::JnHelperMethod::HelperOP_InitCachedFuncs)
                {
                    IR::RegOpnd * scopeObjOpnd = this->currentInstr->GetSrc2()->GetStackSym()->GetInstrDef()->GetSrc1()->AsRegOpnd();
                    return scopeObjOpnd->IsScopeObjOpnd(currFunc);
                }
                break;
            }
        }
    }
    return false;
}